

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiReleaseTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t TimeStep)

{
  long lVar1;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  _TimeStepsEntry *curelm;
  TimeStepsEntry EntryToDelete;
  MpiStreamWR Stream;
  long local_30;
  long *local_28;
  
  (*(code *)*in_RDI)(*in_RSI,5,"Releasing timestep %ld\n",in_RDX);
  pthread_rwlock_rdlock((pthread_rwlock_t *)(in_RSI + 8));
  local_28 = (long *)in_RSI[4];
  pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 8));
  if ((local_28 == (long *)0x0) || (*local_28 != in_RDX)) {
    pthread_rwlock_rdlock((pthread_rwlock_t *)(in_RSI + 8));
    for (local_28 = (long *)in_RSI[4]; (local_28 != (long *)0x0 && (*local_28 != in_RDX));
        local_28 = (long *)local_28[2]) {
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 8));
    if (local_28 != (long *)0x0) {
      pthread_rwlock_wrlock((pthread_rwlock_t *)(in_RSI + 8));
      if ((long *)in_RSI[4] == local_28) {
        lVar1 = *(long *)(in_RSI[4] + 0x10);
        in_RSI[4] = lVar1;
        if (lVar1 == 0) {
          in_RSI[5] = in_RSI + 4;
        }
      }
      else {
        for (local_30 = in_RSI[4]; *(long **)(local_30 + 0x10) != local_28;
            local_30 = *(long *)(local_30 + 0x10)) {
        }
        lVar1 = *(long *)(*(long *)(local_30 + 0x10) + 0x10);
        *(long *)(local_30 + 0x10) = lVar1;
        if (lVar1 == 0) {
          in_RSI[5] = local_30 + 0x10;
        }
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 8));
    }
  }
  else {
    pthread_rwlock_wrlock((pthread_rwlock_t *)(in_RSI + 8));
    lVar1 = *(long *)(in_RSI[4] + 0x10);
    in_RSI[4] = lVar1;
    if (lVar1 == 0) {
      in_RSI[5] = in_RSI + 4;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 8));
  }
  if (local_28 != (long *)0x0) {
    free((void *)local_28[1]);
    free(local_28);
  }
  return;
}

Assistant:

static void MpiReleaseTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t TimeStep)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose, "Releasing timestep %ld\n", TimeStep);

    pthread_rwlock_rdlock(&Stream->LockTS);
    TimeStepsEntry EntryToDelete = STAILQ_FIRST(&Stream->TimeSteps);
    pthread_rwlock_unlock(&Stream->LockTS);

    // Optimal pathway
    if (EntryToDelete && EntryToDelete->TimeStep == TimeStep)
    {
        pthread_rwlock_wrlock(&Stream->LockTS);
        STAILQ_REMOVE_HEAD(&Stream->TimeSteps, entries);
        pthread_rwlock_unlock(&Stream->LockTS);
    }
    else // General pathway
    {
        EntryToDelete = NULL;

        pthread_rwlock_rdlock(&Stream->LockTS);
        STAILQ_FOREACH(EntryToDelete, &Stream->TimeSteps, entries)
        {
            if (EntryToDelete->TimeStep == TimeStep)
            {
                break;
            }
        }
        pthread_rwlock_unlock(&Stream->LockTS);
        if (EntryToDelete)
        {
            pthread_rwlock_wrlock(&Stream->LockTS);
            STAILQ_REMOVE(&Stream->TimeSteps, EntryToDelete, _TimeStepsEntry, entries);
            pthread_rwlock_unlock(&Stream->LockTS);
        }
    }

    if (EntryToDelete)
    {
        free(EntryToDelete->Data);
        free(EntryToDelete);
    }
}